

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeTrackerDevice.cpp
# Opt level: O2

string * __thiscall
MinVR::VRFakeTrackerDevice::printInstructions_abi_cxx11_
          (string *__return_storage_ptr__,VRFakeTrackerDevice *this)

{
  char *pcVar1;
  char tmp [50];
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)local_98);
  std::operator+(&local_58,"Tracker ",&this->_trackerName);
  std::operator+(&local_38,&local_58," is listening to ");
  std::operator+(&local_b8,&local_38,&this->_eventName);
  std::operator+(local_98,&local_b8," events.\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_b8,"Use ",&this->_toggleEvent);
  std::operator+(local_98,&local_b8," to toggle this tracker off and on.\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&this->_rotateOnEvent);
  std::operator+(local_98,"Use ",&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98," to rotate around X (pitch) and Y (yaw),",
             (allocator<char> *)&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&this->_rollOnEvent);
  std::operator+(local_98," and ",&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98," to rotate around Z (roll).\n",(allocator<char> *)&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&this->_translateOnEvent);
  std::operator+(local_98,"Use ",&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98," to translate in X and Y,",(allocator<char> *)&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&this->_translateZOnEvent);
  std::operator+(local_98," and ",&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98," to translate in Z.\n",(allocator<char> *)&local_b8);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_98);
  sprintf((char *)local_98,"xyScale = %.3f, zScale = %.3f, rotation=%.3f",(double)this->_xyScale,
          (double)this->_zScale,(double)this->_rScale);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)local_98,&local_b9)
  ;
  std::operator+(&local_38,"The scale factors are: ",&local_58);
  std::operator+(&local_b8,&local_38,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar1 = "off";
  if (this->_sticky != false) {
    pcVar1 = "on";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_b9);
  std::operator+(&local_38,"Sticky mode is ",&local_58);
  std::operator+(&local_b8,&local_38,",");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar1 = "looker";
  if (this->_seeker != false) {
    pcVar1 = "seeker";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar1,&local_b9);
  std::operator+(&local_38," and the observation style is \'",&local_58);
  std::operator+(&local_b8,&local_38,"\'.\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string VRFakeTrackerDevice::printInstructions() {

  std::string out = "";

  out += "Tracker " + _trackerName + " is listening to " + _eventName + " events.\n";
  out += "Use " + _toggleEvent + " to toggle this tracker off and on.\n";
  out += "Use " + _rotateOnEvent.substr(0, _rotateOnEvent.size() - 5);
  out += std::string(" to rotate around X (pitch) and Y (yaw),");
  out += " and " + _rollOnEvent.substr(0, _rollOnEvent.size() - 5);
  out += std::string(" to rotate around Z (roll).\n");
  out += "Use " + _translateOnEvent.substr(0, _translateOnEvent.size() - 5);
  out += std::string(" to translate in X and Y,");
  out += " and " + _translateZOnEvent.substr(0, _translateZOnEvent.size() - 5);
  out += std::string(" to translate in Z.\n");
  char tmp[50];
  sprintf(tmp, "xyScale = %.3f, zScale = %.3f, rotation=%.3f",
          _xyScale, _zScale, _rScale);
  out += "The scale factors are: " + std::string(tmp) + "\n";
  out += "Sticky mode is " + std::string(_sticky ? "on" : "off") + ",";
  out += " and the observation style is '" + std::string(_seeker ? "seeker" : "looker") + "'.\n";

  return out;
}